

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5StorageSync(Fts5Storage *p)

{
  i64 iVar1;
  Fts5Index *p_00;
  sqlite3_blob *pBlob;
  sqlite3 *psVar2;
  int iVar3;
  
  iVar1 = p->pConfig->db->lastRowid;
  if (p->bTotalsValid == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = fts5StorageSaveTotals(p);
    p->bTotalsValid = 0;
  }
  if (iVar3 == 0) {
    p_00 = p->pIndex;
    fts5IndexFlush(p_00);
    pBlob = p_00->pReader;
    if (pBlob != (sqlite3_blob *)0x0) {
      p_00->pReader = (sqlite3_blob *)0x0;
      sqlite3_blob_close(pBlob);
    }
    iVar3 = p_00->rc;
    p_00->rc = 0;
  }
  psVar2 = p->pConfig->db;
  if (psVar2->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar2->mutex);
  }
  psVar2->lastRowid = iVar1;
  if (psVar2->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2->mutex);
  }
  return iVar3;
}

Assistant:

static int sqlite3Fts5StorageSync(Fts5Storage *p){
  int rc = SQLITE_OK;
  i64 iLastRowid = sqlite3_last_insert_rowid(p->pConfig->db);
  if( p->bTotalsValid ){
    rc = fts5StorageSaveTotals(p);
    p->bTotalsValid = 0;
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexSync(p->pIndex);
  }
  sqlite3_set_last_insert_rowid(p->pConfig->db, iLastRowid);
  return rc;
}